

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O2

void __thiscall
QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate
          (QFileSystemComboBoxPrivate *this,QFileSystemComboBox *widgetP)

{
  QFileSystemComboBox *pQVar1;
  QFileSystemListView *this_00;
  QFileSystemComboBoxCompleter *this_01;
  QAbstractItemModel *pQVar2;
  offset_in_QAbstractItemModel_to_subr oVar3;
  CaseSensitivity CVar4;
  ConnectionType type;
  Object local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  Object local_40 [32];
  
  QObject::QObject(&this->super_QObject,(QObject *)widgetP);
  *(undefined ***)this = &PTR_metaObject_001cbe68;
  this->widget = widgetP;
  this_00 = (QFileSystemListView *)operator_new(0x30);
  QFileSystemListView::QFileSystemListView(this_00,(QWidget *)widgetP);
  this->view = this_00;
  this->initialSorting = true;
  (this->layoutValue).super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_engaged = false;
  if (this->widget != (QFileSystemComboBox *)0x0) {
    QFileSystemListView::setBrowsable(this_00,false);
    QFileSystemListView::setReadOnly(this->view,true);
    QObject::blockSignals(SUB81(this->widget,0));
    QComboBox::setEditable(SUB81(this->widget,0));
    pQVar1 = this->widget;
    QAbstractItemView::model();
    QComboBox::setModel((QAbstractItemModel *)pQVar1);
    QComboBox::setView((QAbstractItemView *)this->widget);
    pQVar1 = this->widget;
    QAbstractItemView::rootIndex();
    QComboBox::setRootModelIndex((QModelIndex *)pQVar1);
    QComboBox::setCurrentIndex((int)this->widget);
    this_01 = (QFileSystemComboBoxCompleter *)operator_new(0x10);
    pQVar2 = (QAbstractItemModel *)QAbstractItemView::model();
    QFileSystemComboBoxCompleter::QCompleter(this_01,pQVar2,&this->super_QObject);
    CVar4 = (CaseSensitivity)this_01;
    QCompleter::setCaseSensitivity(CVar4);
    QCompleter::setCompletionRole(CVar4);
    QCompleter::setFilterMode(this_01,1);
    QCompleter::setModelSorting(CVar4);
    QComboBox::setCompleter((QCompleter *)this->widget);
    oVar3 = QComboBox::model();
    QObject::
    connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda()_1_>
              (local_40,oVar3,(QObject *)QAbstractItemModel::layoutAboutToBeChanged,
               (anon_class_8_1_8991fb9c_for_function)0x0,(ConnectionType)this->widget);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    oVar3 = QComboBox::model();
    QObject::
    connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda()_2_>
              ((Object *)(local_50 + 8),oVar3,(QObject *)QAbstractItemModel::layoutChanged,
               (anon_class_8_1_8991fb9c_for_function)0x0,(ConnectionType)this->widget);
    QMetaObject::Connection::~Connection((Connection *)(local_50 + 8));
    type = (ConnectionType)this;
    QObject::
    connect<void(QFileSystemListView::*)(QString_const&),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(QString_const&)_1_>
              ((Object *)local_50,(offset_in_QFileSystemListView_to_subr)this->view,
               (QObject *)QFileSystemListView::directoryLoaded,
               (anon_class_8_1_8991fb9c_for_function)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    QObject::
    connect<void(QFileSystemListView::*)(QString_const&),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(QString_const&)_2_>
              ((Object *)local_58,(offset_in_QFileSystemListView_to_subr)this->view,
               (QObject *)QFileSystemListView::rootPathChanged,
               (anon_class_8_1_8991fb9c_for_function)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    QObject::
    connect<void(QComboBox::*)(int),QFileSystemComboBoxPrivate::QFileSystemComboBoxPrivate(QFileSystemComboBox*)::_lambda(int)_1_>
              (local_60,(offset_in_QComboBox_to_subr)this->widget,
               (QObject *)QComboBox::currentIndexChanged,(anon_class_8_1_8991fb9c_for_function)0x0,
               type);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    return;
  }
  qt_assert("widget",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/FileSystem/QFileSystemComboBox.cpp"
            ,0x24);
}

Assistant:

explicit QFileSystemComboBoxPrivate(QFileSystemComboBox *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , view(new QFileSystemListView(widget)) {
        Q_ASSERT(widget);

        view->setBrowsable(false);
        view->setReadOnly(true);

        widget->blockSignals(true);
        widget->QComboBox::setEditable(true);
        widget->QComboBox::setModel(view->model());
        widget->QComboBox::setView(view);
        widget->QComboBox::setRootModelIndex(view->rootIndex());
        widget->QComboBox::setCurrentIndex(-1);

        auto completer = new QFileSystemComboBoxCompleter(view->model(), this);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionRole(Qt::DisplayRole);
        completer->setFilterMode(Qt::MatchContains);
        completer->setModelSorting(QCompleter::CaseInsensitivelySortedModel);
        widget->setCompleter(completer);

        // QFileSystemModel sorting is delayed and use layoutChanged.
        // And QComboBox model watching does not listen to layoutChanged...

        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutAboutToBeChanged, widget, [this]() {
            if (!initialSorting && !layoutValue) {
                layoutValue = qMakePair(widget->currentIndex(), QFileInfo(widget->currentFilePath()));
            }
        });
        connect(widget->QComboBox::model(), &QAbstractItemModel::layoutChanged, widget, [this]() {
            if (initialSorting && !layoutValue && widget->QComboBox::model()->rowCount(widget->QComboBox::rootModelIndex()) > 0) {
                layoutValue = qMakePair(0, QFileInfo(widget->filePath(0)));
            }

            initialSorting = false;

            bool done = false;

            if (layoutValue) {
                Q_ASSERT(layoutValue->second.filePath().isEmpty() || view->rootPath() == layoutValue->second.path());

                // If we have both a valid index and file path, both needs to match
                if (layoutValue->first >= 0 && !layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (layoutValue->first >= 0) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(layoutValue->first);
                } else if (!layoutValue->second.filePath().isEmpty()) {
                    done = true;
                    widget->QComboBox::setCurrentIndex(widget->findFileName(layoutValue->second.fileName()));
                } else {
                    Q_UNREACHABLE();
                }
            }

            layoutValue.reset();

            if (!done) {
                widget->QComboBox::setCurrentIndex(-1);
            }
        });

        connect(view, &QFileSystemListView::directoryLoaded, this, [this](const QString &path) {
            if (widget->signalsBlocked()) {
                widget->blockSignals(false);
            }

            Q_EMIT widget->directoryLoaded(path);
        });

        connect(view, &QFileSystemListView::rootPathChanged, this, [this](const QString &path) {
            widget->QComboBox::setRootModelIndex(view->rootIndex());
            Q_EMIT widget->rootPathChanged(path);
        });

        connect(widget, qOverload<int>(&QComboBox::currentIndexChanged), this, [this](int index) {
            Q_EMIT widget->currentFileNameChanged(widget->fileName(index));
            Q_EMIT widget->currentFilePathChanged(widget->filePath(index));
        });
    }